

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O3

Regexp * __thiscall
duckdb_re2::Regexp::Walker<duckdb_re2::Regexp_*>::WalkInternal
          (Walker<duckdb_re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
  *this_00;
  iterator *piVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Elt_pointer pWVar6;
  Regexp **ppRVar7;
  Regexp *pRVar8;
  ulong uVar9;
  bool stop;
  undefined1 local_1b0 [8];
  int iStack_1a8;
  undefined4 uStack_1a4;
  Regexp *local_1a0;
  Regexp *pRStack_198;
  Regexp *local_190;
  Regexp **ppRStack_188;
  ios_base local_138 [264];
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_1a8,"Walk NULL",9);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    this_00 = &this->stack_;
    iStack_1a8 = -1;
    ppRStack_188 = (Regexp **)0x0;
    pWVar6 = (this->stack_).c.
             super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_1b0 = (undefined1  [8])re;
    local_1a0 = top_arg;
    if (pWVar6 == (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
      ::_M_push_back_aux<duckdb_re2::WalkState<duckdb_re2::Regexp*>>
                ((deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
                  *)this_00,(WalkState<duckdb_re2::Regexp_*> *)local_1b0);
    }
    else {
      pWVar6->child_arg = local_190;
      pWVar6->child_args = (Regexp **)0x0;
      pWVar6->parent_arg = top_arg;
      pWVar6->pre_arg = pRStack_198;
      pWVar6->re = re;
      *(ulong *)&pWVar6->n = CONCAT44(uStack_1a4,0xffffffff);
      piVar1 = &(this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
LAB_01cb2d56:
    while( true ) {
      pWVar6 = (this->stack_).c.
               super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar6 == (this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar6 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar8 = pWVar6[-1].re;
      uVar9 = (ulong)(uint)pWVar6[-1].n;
      if (pWVar6[-1].n == 0xffffffff) break;
LAB_01cb2d79:
      uVar2 = pRVar8->nsub_;
      if (uVar2 == 0) {
LAB_01cb2e55:
        iVar4 = (*this->_vptr_Walker[3])
                          (this,pRVar8,pWVar6[-1].parent_arg,pWVar6[-1].pre_arg,
                           pWVar6[-1].child_args);
        top_arg = (Regexp *)CONCAT44(extraout_var_01,iVar4);
        if ((1 < pRVar8->nsub_) && (pWVar6[-1].child_args != (Regexp **)0x0)) {
          operator_delete__(pWVar6[-1].child_args);
        }
        goto LAB_01cb2e9f;
      }
      if (uVar2 == 1) {
        paVar5 = &pRVar8->field_5;
      }
      else {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar8->field_5).submany_;
      }
      iVar4 = (int)uVar9;
      if ((int)(uint)uVar2 <= iVar4) goto LAB_01cb2e55;
      if (use_copy && 0 < iVar4) {
        pRVar8 = (Regexp *)paVar5[uVar9].submany_;
        if ((Regexp *)paVar5[iVar4 - 1U].submany_ != pRVar8) goto LAB_01cb2ef1;
        iVar3 = (*this->_vptr_Walker[4])(this,pWVar6[-1].child_args[iVar4 - 1U]);
        iVar4 = pWVar6[-1].n;
        pWVar6[-1].child_args[iVar4] = (Regexp *)CONCAT44(extraout_var_00,iVar3);
        pWVar6[-1].n = iVar4 + 1;
      }
      else {
        pRVar8 = (Regexp *)paVar5[iVar4].submany_;
LAB_01cb2ef1:
        local_1a0 = pWVar6[-1].pre_arg;
        iStack_1a8 = -1;
        ppRStack_188 = (Regexp **)0x0;
        pWVar6 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_1b0 = (undefined1  [8])pRVar8;
        if (pWVar6 == (this->stack_).c.
                      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::
          deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
          ::_M_push_back_aux<duckdb_re2::WalkState<duckdb_re2::Regexp*>>
                    ((deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
                      *)this_00,(WalkState<duckdb_re2::Regexp_*> *)local_1b0);
        }
        else {
          pWVar6->child_arg = local_190;
          pWVar6->child_args = (Regexp **)0x0;
          pWVar6->parent_arg = local_1a0;
          pWVar6->pre_arg = pRStack_198;
          pWVar6->re = pRVar8;
          *(ulong *)&pWVar6->n = CONCAT44(uStack_1a4,0xffffffff);
          piVar1 = &(this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
    }
    iVar4 = this->max_visits_;
    this->max_visits_ = iVar4 + -1;
    if (iVar4 < 1) {
      this->stopped_early_ = true;
      iVar4 = (*this->_vptr_Walker[5])(this,pRVar8,pWVar6[-1].parent_arg);
      top_arg = (Regexp *)CONCAT44(extraout_var_02,iVar4);
    }
    else {
      local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
      iVar4 = (*this->_vptr_Walker[2])(this,pRVar8,pWVar6[-1].parent_arg,local_1b0);
      top_arg = (Regexp *)CONCAT44(extraout_var,iVar4);
      pWVar6[-1].pre_arg = top_arg;
      if (local_1b0[0] == '\0') {
        pWVar6[-1].n = 0;
        pWVar6[-1].child_args = (Regexp **)0x0;
        uVar2 = pRVar8->nsub_;
        uVar9 = (ulong)uVar2;
        if (uVar2 != 0) {
          if (uVar2 == 1) {
            pWVar6[-1].child_args = &pWVar6[-1].child_arg;
            uVar9 = 0;
          }
          else {
            ppRVar7 = (Regexp **)operator_new__((ulong)uVar2 << 3);
            pWVar6[-1].child_args = ppRVar7;
            uVar9 = (ulong)(uint)pWVar6[-1].n;
          }
        }
        goto LAB_01cb2d79;
      }
    }
LAB_01cb2e9f:
    std::
    deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
    ::pop_back(&this_00->c);
    pWVar6 = (this->stack_).c.
             super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar6 != (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pWVar6 == (this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar6 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      if (pWVar6[-1].child_args == (Regexp **)0x0) {
        pWVar6[-1].child_arg = top_arg;
        iVar4 = pWVar6[-1].n;
      }
      else {
        iVar4 = pWVar6[-1].n;
        pWVar6[-1].child_args[iVar4] = top_arg;
      }
      pWVar6[-1].n = iVar4 + 1;
      goto LAB_01cb2d56;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}